

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpio.c
# Opt level: O0

char * cpio_rename(char *name)

{
  char *pcVar1;
  FILE *__stream;
  bool bVar2;
  char *ret;
  char *p;
  FILE *t;
  char *name_local;
  
  __stream = fopen("/dev/tty","r+");
  name_local = name;
  if (__stream != (FILE *)0x0) {
    fprintf(__stream,"%s (Enter/./(new name))? ",name);
    fflush(__stream);
    ret = fgets(cpio_rename::buff,0x400,__stream);
    fclose(__stream);
    if (ret == (char *)0x0) {
      name_local = (char *)0x0;
    }
    else {
      while( true ) {
        pcVar1 = ret;
        bVar2 = true;
        if (*ret != ' ') {
          bVar2 = *ret == '\t';
        }
        if (!bVar2) break;
        ret = ret + 1;
      }
      if ((*ret == '\n') || (*ret == '\0')) {
        name_local = (char *)0x0;
      }
      else if ((*ret != '.') || (ret[1] != '\n')) {
        while( true ) {
          bVar2 = false;
          if (*ret != '\0') {
            bVar2 = *ret != '\n';
          }
          if (!bVar2) break;
          ret = ret + 1;
        }
        *ret = '\0';
        name_local = pcVar1;
      }
    }
  }
  return name_local;
}

Assistant:

static const char *
cpio_rename(const char *name)
{
	static char buff[1024];
	FILE *t;
	char *p, *ret;
#if defined(_WIN32) && !defined(__CYGWIN__)
	FILE *to;

	t = fopen("CONIN$", "r");
	if (t == NULL)
		return (name);
	to = fopen("CONOUT$", "w");
	if (to == NULL) {
		fclose(t);
		return (name);
	}
	fprintf(to, "%s (Enter/./(new name))? ", name);
	fclose(to);
#else
	t = fopen("/dev/tty", "r+");
	if (t == NULL)
		return (name);
	fprintf(t, "%s (Enter/./(new name))? ", name);
	fflush(t);
#endif

	p = fgets(buff, sizeof(buff), t);
	fclose(t);
	if (p == NULL)
		/* End-of-file is a blank line. */
		return (NULL);

	while (*p == ' ' || *p == '\t')
		++p;
	if (*p == '\n' || *p == '\0')
		/* Empty line. */
		return (NULL);
	if (*p == '.' && p[1] == '\n')
		/* Single period preserves original name. */
		return (name);
	ret = p;
	/* Trim the final newline. */
	while (*p != '\0' && *p != '\n')
		++p;
	/* Overwrite the final \n with a null character. */
	*p = '\0';
	return (ret);
}